

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_function-c.cpp
# Opt level: O3

duckdb_scalar_function_set duckdb_create_scalar_function_set(char *name)

{
  duckdb_scalar_function_set this;
  size_t sVar1;
  string local_38;
  
  if ((name == (char *)0x0) || (*name == '\0')) {
    this = (duckdb_scalar_function_set)0x0;
  }
  else {
    this = (duckdb_scalar_function_set)operator_new(0x38);
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    sVar1 = strlen(name);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,name,name + sVar1);
    duckdb::ScalarFunctionSet::ScalarFunctionSet((ScalarFunctionSet *)this,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
  }
  return this;
}

Assistant:

duckdb_scalar_function_set duckdb_create_scalar_function_set(const char *name) {
	if (!name || !*name) {
		return nullptr;
	}
	auto function = new duckdb::ScalarFunctionSet(name);
	return reinterpret_cast<duckdb_scalar_function_set>(function);
}